

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool __thiscall leveldb::Version::UpdateStats(Version *this,GetStats *stats)

{
  int iVar1;
  long lVar2;
  FileMetaData *pFVar3;
  bool bVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = stats->seek_file;
  if (((pFVar3 == (FileMetaData *)0x0) ||
      (iVar1 = pFVar3->allowed_seeks, pFVar3->allowed_seeks = iVar1 + -1, 1 < iVar1)) ||
     (this->file_to_compact_ != (FileMetaData *)0x0)) {
    bVar4 = false;
  }
  else {
    this->file_to_compact_ = pFVar3;
    this->file_to_compact_level_ = stats->seek_file_level;
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Version::UpdateStats(const GetStats& stats) {
  FileMetaData* f = stats.seek_file;
  if (f != nullptr) {
    f->allowed_seeks--;
    if (f->allowed_seeks <= 0 && file_to_compact_ == nullptr) {
      file_to_compact_ = f;
      file_to_compact_level_ = stats.seek_file_level;
      return true;
    }
  }
  return false;
}